

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O3

void __thiscall Liby::EventQueue::~EventQueue(EventQueue *this)

{
  FileDescriptor *__ptr;
  
  std::condition_variable::~condition_variable(&(this->eventHandlers_).cond_);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->eventHandlers_).queue_.
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            (&this->eventChanelPtr_);
  __ptr = (this->eventfp_)._M_t.
          super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>.
          _M_t.
          super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>
          .super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl;
  if (__ptr != (FileDescriptor *)0x0) {
    std::default_delete<Liby::FileDescriptor>::operator()
              ((default_delete<Liby::FileDescriptor> *)&this->eventfp_,__ptr);
  }
  (this->eventfp_)._M_t.
  super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>._M_t.
  super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>.
  super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl = (FileDescriptor *)0x0;
  return;
}

Assistant:

EventQueue::~EventQueue() {
    //　使eventChanelPtr_析构时不去调用Poller基类的虚函数
    if (eventChanelPtr_) {
        //        eventChanelPtr_->setPoller(nullptr);
    }
}